

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O2

void __thiscall
stateObservation::IndexedMatrixArray::writeInFile(IndexedMatrixArray *this,char *filename)

{
  uint uVar1;
  size_type sVar2;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_00;
  Scalar *pSVar3;
  int j;
  long col;
  ulong uVar4;
  int i;
  long row;
  ofstream f;
  
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,(_Ios_Openmode)filename);
  sVar2 = std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(&this->v_);
  if ((int)sVar2 != 0) {
    uVar1 = getFirstIndex(this);
    uVar4 = (ulong)uVar1;
    while( true ) {
      uVar1 = getLastIndex(this);
      if (uVar1 < uVar4) break;
      std::ostream::_M_insert<unsigned_long>((ulong)&f);
      this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                operator[](this,(uint)uVar4);
      for (row = 0; row < *(long *)(this_00 + 8); row = row + 1) {
        for (col = 0; col < *(long *)(this_00 + 0x10); col = col + 1) {
          std::operator<<((ostream *)&f," ");
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (this_00,row,col);
          std::ostream::_M_insert<double>(*pSVar3);
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&f);
      uVar4 = uVar4 + 1;
    }
  }
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void IndexedMatrixArray::writeInFile(const char * filename)
    {
    	std::ofstream f;

      f.open(filename);

      if (size()>0)
      {

        for (size_t k=getFirstIndex();k<=getLastIndex();++k)
        {

            f << k;

            Matrix & m = operator[](k);

            for (int i = 0 ; i< m.rows(); ++i)
            {
              for (int j = 0 ; j< m.cols(); ++j)
              {
            		f << " "<< m(i,j);
              }
            }

            f << std::endl;
        }
      }
    }